

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd __thiscall sylvan::Bdd::Restrict(Bdd *this,Bdd *c)

{
  BDD from;
  BDDVAR in_ECX;
  BDD *in_RDX;
  Bdd *c_local;
  Bdd *this_local;
  
  from = sylvan_restrict_RUN((sylvan *)c->bdd,*in_RDX,0,in_ECX);
  Bdd(this,from);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::Restrict(const Bdd &c) const
{
    return sylvan_restrict(bdd, c.bdd);
}